

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

void __thiscall
llvm::
SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
::push_back(SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
            *this,unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_> *Elt)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = (this->
          super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
          ).super_SmallVectorBase.Size;
  uVar2 = (this->
          super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
          ).super_SmallVectorBase.Capacity;
  if (uVar2 <= uVar1) {
    grow(this,0);
    uVar1 = (this->
            super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
            ).super_SmallVectorBase.Size;
    uVar2 = (this->
            super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
            ).super_SmallVectorBase.Capacity;
  }
  *(DWARFUnit **)
   ((long)(this->
          super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
          ).super_SmallVectorBase.BeginX + (ulong)uVar1 * 8) =
       (Elt->_M_t).super___uniq_ptr_impl<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>.
       _M_t.super__Tuple_impl<0UL,_llvm::DWARFUnit_*,_std::default_delete<llvm::DWARFUnit>_>.
       super__Head_base<0UL,_llvm::DWARFUnit_*,_false>._M_head_impl;
  (Elt->_M_t).super___uniq_ptr_impl<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>._M_t.
  super__Tuple_impl<0UL,_llvm::DWARFUnit_*,_std::default_delete<llvm::DWARFUnit>_>.
  super__Head_base<0UL,_llvm::DWARFUnit_*,_false>._M_head_impl = (DWARFUnit *)0x0;
  if (uVar1 < uVar2) {
    (this->
    super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
    ).super_SmallVectorBase.Size = uVar1 + 1;
    return;
  }
  __assert_fail("N <= capacity()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/include/llvm/ADT/SmallVector.h"
                ,0x43,"void llvm::SmallVectorBase::set_size(size_t)");
}

Assistant:

void push_back(T &&Elt) {
    if (LLVM_UNLIKELY(this->size() >= this->capacity()))
      this->grow();
    ::new ((void*) this->end()) T(::std::move(Elt));
    this->set_size(this->size() + 1);
  }